

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_AnyPolicyWithQualifier_Test::
TestBody(ParseCertificatePoliciesExtensionOidsTest_AnyPolicyWithQualifier_Test *this)

{
  Input extension_value;
  bool bVar1;
  ParamType *pPVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_a0;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  AssertHelper local_50;
  CertErrors errors;
  string der;
  
  der._M_dataplus._M_p = (pointer)&der.field_2;
  der._M_string_length = 0;
  der.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"anypolicy_with_qualifier.pem",(allocator<char> *)&errors);
  LoadTestData((anon_unknown_0 *)&policies,(string *)&gtest_ar,&der);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
            .super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&errors);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&policies,
               (AssertionResult *)"LoadTestData(\"anypolicy_with_qualifier.pem\", &der)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x57,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&errors);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    ::std::__cxx11::string::~string((string *)&gtest_ar);
    if (errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)errors.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&policies.
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&policies.
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CertErrors::CertErrors(&errors);
    extension_value.data_.size_ = der._M_string_length;
    extension_value.data_.data_ = (uchar *)der._M_dataplus._M_p;
    pPVar2 = testing::WithParamInterface<bool>::GetParam();
    bVar1 = ParseCertificatePoliciesExtensionOids(extension_value,*pPVar2,&policies,&errors);
    gtest_ar__1.success_ = bVar1;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                 (AssertionResult *)
                 "ParseCertificatePoliciesExtensionOids( StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies, &errors)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x5c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      ::std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    local_a0.data_._0_4_ = 1;
    gtest_ar__1._0_8_ =
         (long)policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"1U","policies.size()",(uint *)&local_a0,
               (unsigned_long *)&gtest_ar__1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x5d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
    else {
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar__1._0_8_ = &kAnyPolicyOid;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x4;
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)&gtest_ar,"der::Input(kAnyPolicyOid)","policies[0]",
                 (Input *)&gtest_ar__1,
                 policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x5e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    CertErrors::~CertErrors(&errors);
    ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
              (&policies.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>);
  }
  ::std::__cxx11::string::~string((string *)&der);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}